

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O1

void __thiscall
llm_build_qwen::llm_build_qwen
          (llm_build_qwen *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  llama_hparams *plVar2;
  ggml_context *pgVar3;
  long lVar4;
  pointer plVar5;
  ggml_tensor *pgVar6;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ggml_tensor *pgVar11;
  ggml_tensor *cur;
  ggml_tensor *cur_00;
  long lVar12;
  int il;
  long lVar13;
  float __x;
  float fVar14;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar15;
  ggml_tensor *local_58;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  plVar2 = (this->super_llm_graph_context).hparams;
  uVar1 = plVar2->n_embd_head_v;
  if (uVar1 != plVar2->n_embd_head_k) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1858,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  local_58 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  pgVar6 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
  inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
  if (0 < (this->super_llm_graph_context).n_layer) {
    __x = (float)uVar1;
    lVar12 = 0;
    lVar13 = 0;
    do {
      uVar15 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
      il = (int)lVar13;
      pgVar7 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,local_58,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->attn_norm + lVar12),
                          (ggml_tensor *)0x0,LLM_NORM_RMS,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"attn_norm",il);
      pgVar7 = llm_graph_context::build_lora_mm
                         (&this->super_llm_graph_context,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->wqkv + lVar12),pgVar7
                         );
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"wqkv",il);
      pgVar7 = (ggml_tensor *)
               ggml_add((this->super_llm_graph_context).ctx0,pgVar7,
                        *(undefined8 *)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->bqkv + lVar12));
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"bqkv",il);
      pgVar3 = (this->super_llm_graph_context).ctx0;
      uVar8 = ggml_view_2d(pgVar3,pgVar7,(this->super_llm_graph_context).n_embd,
                           (long)(this->super_llm_graph_context).n_tokens,pgVar7->nb[1],0);
      uVar8 = ggml_cont(pgVar3,uVar8);
      lVar4 = (this->super_llm_graph_context).n_embd;
      pgVar3 = (this->super_llm_graph_context).ctx0;
      uVar9 = ggml_view_2d(pgVar3,pgVar7,lVar4,(long)(this->super_llm_graph_context).n_tokens,
                           pgVar7->nb[1],lVar4 * 4);
      uVar9 = ggml_cont(pgVar3,uVar9);
      lVar4 = (this->super_llm_graph_context).n_embd;
      pgVar3 = (this->super_llm_graph_context).ctx0;
      uVar10 = ggml_view_2d(pgVar3,pgVar7,lVar4,(long)(this->super_llm_graph_context).n_tokens,
                            pgVar7->nb[1],lVar4 * 8);
      uVar10 = ggml_cont(pgVar3,uVar10);
      uVar8 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar8,uVar1,
                              (this->super_llm_graph_context).n_head,
                              (long)(this->super_llm_graph_context).n_tokens);
      uVar9 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar9,uVar1,
                              (this->super_llm_graph_context).n_head_kv,
                              (long)(this->super_llm_graph_context).n_tokens);
      pgVar11 = (ggml_tensor *)
                ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar10,uVar1,
                                (this->super_llm_graph_context).n_head_kv,
                                (long)(this->super_llm_graph_context).n_tokens);
      cur = (ggml_tensor *)
            ggml_rope_ext((this->super_llm_graph_context).freq_base,
                          (this->super_llm_graph_context).freq_scale,
                          (this->super_llm_graph_context).ext_factor,
                          (this->super_llm_graph_context).attn_factor,
                          (this->super_llm_graph_context).beta_fast,
                          (this->super_llm_graph_context).beta_slow,
                          (this->super_llm_graph_context).ctx0,uVar8,pgVar6,0,
                          (int)(this->super_llm_graph_context).n_rot,
                          (this->super_llm_graph_context).rope_type,
                          CONCAT44(uVar15,(this->super_llm_graph_context).n_ctx_orig));
      cur_00 = (ggml_tensor *)
               ggml_rope_ext((this->super_llm_graph_context).freq_base,
                             (this->super_llm_graph_context).freq_scale,
                             (this->super_llm_graph_context).ext_factor,
                             (this->super_llm_graph_context).attn_factor,
                             (this->super_llm_graph_context).beta_fast,
                             (this->super_llm_graph_context).beta_slow,
                             (this->super_llm_graph_context).ctx0,uVar9,pgVar6,0,
                             (int)(this->super_llm_graph_context).n_rot,
                             (this->super_llm_graph_context).rope_type,
                             (this->super_llm_graph_context).n_ctx_orig);
      llm_graph_context::cb(&this->super_llm_graph_context,cur,"Qcur",il);
      llm_graph_context::cb(&this->super_llm_graph_context,cur_00,"Kcur",il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"Vcur",il);
      pgVar7 = *(ggml_tensor **)
                ((long)&((model->layers).
                         super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                         super__Vector_impl_data._M_start)->wo + lVar12);
      fVar14 = SQRT(__x);
      if (__x < 0.0) {
        fVar14 = sqrtf(__x);
      }
      pgVar7 = llm_graph_context::build_attn
                         (&this->super_llm_graph_context,inp,gf,pgVar7,(ggml_tensor *)0x0,cur,cur_00
                          ,pgVar11,(ggml_tensor *)0x0,(ggml_tensor *)0x0,1.0 / fVar14,il);
      if (lVar13 == (this->super_llm_graph_context).n_layer + -1) {
        pgVar11 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
        pgVar7 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar7,pgVar11);
        local_58 = (ggml_tensor *)
                   ggml_get_rows((this->super_llm_graph_context).ctx0,local_58,pgVar11);
      }
      pgVar7 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar7,local_58);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"ffn_inp",il);
      pgVar11 = llm_graph_context::build_norm
                          (&this->super_llm_graph_context,pgVar7,
                           *(ggml_tensor **)
                            ((long)&((model->layers).
                                     super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->ffn_norm + lVar12),
                           (ggml_tensor *)0x0,LLM_NORM_RMS,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"ffn_norm",il);
      plVar5 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      in_stack_ffffffffffffff38 = 0;
      pgVar11 = llm_graph_context::build_ffn
                          (&this->super_llm_graph_context,pgVar11,
                           *(ggml_tensor **)((long)&plVar5->ffn_up + lVar12),(ggml_tensor *)0x0,
                           (ggml_tensor *)0x0,*(ggml_tensor **)((long)&plVar5->ffn_gate + lVar12),
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                           *(ggml_tensor **)((long)&plVar5->ffn_down + lVar12),(ggml_tensor *)0x0,
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_SILU,LLM_FFN_PAR,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"ffn_out",il);
      pgVar7 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar11,pgVar7);
      local_58 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar7,il);
      llm_graph_context::cb(&this->super_llm_graph_context,local_58,"l_out",il);
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x4f0;
    } while (lVar13 < (this->super_llm_graph_context).n_layer);
  }
  pgVar6 = llm_graph_context::build_norm
                     (&this->super_llm_graph_context,local_58,model->output_norm,(ggml_tensor *)0x0,
                      LLM_NORM_RMS,-1);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"result_norm",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar6;
  pgVar6 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar6);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"result_output",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar6;
  ggml_build_forward_expand(gf,pgVar6);
  return;
}

Assistant:

llm_build_qwen(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                cur = build_lora_mm(model.layers[il].wqkv, cur);
                cb(cur, "wqkv", il);

                cur = ggml_add(ctx0, cur, model.layers[il].bqkv);
                cb(cur, "bqkv", il);

                ggml_tensor * Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd, n_tokens, cur->nb[1], 0*sizeof(float)*(n_embd)));
                ggml_tensor * Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd)));
                ggml_tensor * Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd, n_tokens, cur->nb[1], 2*sizeof(float)*(n_embd)));

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                // using mode = 2 for neox mode
                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward forward
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }